

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

void __thiscall Language::Grammar::Grammar(Grammar *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar1;
  Rule *this_00;
  mapped_type *ppRVar2;
  __node_base *p_Var3;
  string local_50;
  
  (this->ruleNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ruleNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ruleNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RULES)._M_h._M_buckets = &(this->RULES)._M_h._M_single_bucket;
  (this->RULES)._M_h._M_bucket_count = 1;
  (this->RULES)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->RULES)._M_h._M_element_count = 0;
  (this->RULES)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->RULES)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->RULES)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = Rule::getTerminals_abi_cxx11_();
  p_Var3 = &(puVar1->_M_h)._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ruleNames,(value_type *)(p_Var3 + 1));
  }
  puVar1 = Rule::getTerminals_abi_cxx11_();
  p_Var3 = &(puVar1->_M_h)._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    this_00 = (Rule *)operator_new(200);
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
    Rule::Rule(this_00,&local_50);
    ppRVar2 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Language::Rule_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Language::Rule_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Language::Rule_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Language::Rule_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->RULES,(key_type *)(p_Var3 + 1));
    *ppRVar2 = this_00;
    std::__cxx11::string::~string((string *)&local_50);
  }
  parseGrammar(this);
  constructFirstSet(this);
  constructFollowSet(this);
  return;
}

Assistant:

Language::Grammar::Grammar() {
    // Adding terminals to RULES map
    for (const auto &_rule: Rule::getTerminals()) ruleNames.push_back(_rule.first);
    for (const auto &_rule: Rule::getTerminals()) RULES[_rule.first] = new Rule(_rule.first);
    parseGrammar();
    constructFirstSet();
    constructFollowSet();
}